

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLSegmentedStream::~ON_XMLSegmentedStream(ON_XMLSegmentedStream *this)

{
  ON_SimpleArray<wchar_t_*> *this_00;
  long lVar1;
  
  this->_vptr_ON_XMLSegmentedStream = (_func_int **)&PTR__ON_XMLSegmentedStream_0082b790;
  this_00 = &this->_private->m_a;
  if (0 < this_00->m_count) {
    lVar1 = 0;
    do {
      if (this_00->m_a[lVar1] != (wchar_t *)0x0) {
        operator_delete__(this_00->m_a[lVar1]);
      }
      lVar1 = lVar1 + 1;
      this_00 = &this->_private->m_a;
    } while (lVar1 < this_00->m_count);
  }
  if (this_00 != (ON_SimpleArray<wchar_t_*> *)0x0) {
    ON_SimpleArray<wchar_t_*>::~ON_SimpleArray(this_00);
    operator_delete(this_00,0x18);
    return;
  }
  return;
}

Assistant:

ON_XMLSegmentedStream::~ON_XMLSegmentedStream()
{
  for (int i = 0; i < _private->m_a.Count(); i++)
  {
    delete[] _private->m_a[i];
  }

  delete _private;
}